

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::overlap_iterator::unionWith
          (overlap_iterator *this,monostate *value,allocator_type *alloc)

{
  interval<unsigned_long> newKey;
  interval<unsigned_long> newKey_00;
  interval<unsigned_long> newKey_01;
  bool bVar1;
  uint32_t i;
  uint32_t uVar2;
  interval<unsigned_long> *this_00;
  uint32_t *puVar3;
  overlap_iterator *this_01;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *this_02;
  Path *in_RDI;
  iterator nextIt;
  bool modifiedPath;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *leaf_1;
  LeafNode<unsigned_long,_std::monostate,_3U,_true> *leaf;
  interval<unsigned_long> currKey;
  bool canUnionRight;
  uint32_t offset;
  anon_class_16_2_46e3eac0 updateCurrKey;
  anon_class_16_2_3faad3b2 getCurrKey;
  Path *path;
  IntervalMap<unsigned_long,_std::monostate,_3U> *map;
  undefined4 in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeac;
  const_iterator *in_stack_fffffffffffffeb0;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint32_t in_stack_fffffffffffffec4;
  interval<unsigned_long> *in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint32_t in_stack_fffffffffffffeec;
  overlap_iterator *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  allocator_type *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int iVar4;
  undefined4 in_stack_ffffffffffffff1c;
  unsigned_long in_stack_ffffffffffffff20;
  unsigned_long in_stack_ffffffffffffff28;
  iterator *in_stack_ffffffffffffff30;
  bool local_5d;
  
  bVar1 = const_iterator::isFlat(in_stack_fffffffffffffeb0);
  if (bVar1) {
    IntervalMapDetails::
    NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_3U,_true>_>
    ::findUnionLeft((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_3U,_true>_>
                     *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                    in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    const_iterator::setRoot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  else {
    IntervalMapDetails::
    NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_2U,_true>_>::
    findUnionLeft((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_2U,_true>_>
                   *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                  in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    const_iterator::setRoot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    treeFindUnion(in_stack_fffffffffffffef0);
  }
  bVar1 = const_iterator::valid((const_iterator *)0x9e5915);
  if (bVar1) {
    this_00 = unionWith::anon_class_16_2_3faad3b2::operator()
                        ((anon_class_16_2_3faad3b2 *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    bVar1 = IntervalMapDetails::interval<unsigned_long>::overlapsOrAdjacent
                      (this_00,(interval<unsigned_long> *)
                               &in_RDI[1].path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len);
    if (bVar1) {
      newKey.right._0_4_ = in_stack_fffffffffffffec0;
      newKey.left = (unsigned_long)in_stack_fffffffffffffeb8;
      newKey.right._4_4_ = in_stack_fffffffffffffec4;
      unionWith::anon_class_16_2_46e3eac0::operator()
                ((anon_class_16_2_46e3eac0 *)in_stack_fffffffffffffeb0,newKey);
      IntervalMapDetails::Path::height((Path *)in_stack_fffffffffffffeb0);
      IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::updateParentBounds
                ((iterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (interval<unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    }
    else {
      IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::insert
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (monostate *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
    }
    do {
      while( true ) {
        puVar3 = IntervalMapDetails::Path::leafOffset((Path *)0x9e5a24);
        i = *puVar3 + 1;
        bVar1 = const_iterator::isFlat(in_stack_fffffffffffffeb0);
        if (bVar1) {
          this_01 = (overlap_iterator *)
                    IntervalMapDetails::Path::
                    leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,3u,true>>
                              ((Path *)0x9e5a50);
          in_stack_fffffffffffffef0 = this_01;
          in_stack_fffffffffffffefc = i;
          IntervalMapDetails::Path::leafSize((Path *)0x9e5a7d);
          local_5d = IntervalMapDetails::
                     NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_3U,_true>_>
                     ::canUnionRight((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_3U,_true>_>
                                      *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                                                ),
                                     (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                                     (uint32_t)in_stack_fffffffffffffec8,
                                     (interval<unsigned_long> *)
                                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_3U,_true>::keyAt
                    ((LeafNode<unsigned_long,_std::monostate,_3U,_true> *)this_01,i);
        }
        else {
          this_02 = IntervalMapDetails::Path::
                    leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                              ((Path *)0x9e5adc);
          in_stack_fffffffffffffeec = i;
          IntervalMapDetails::Path::leafSize((Path *)0x9e5b09);
          local_5d = IntervalMapDetails::
                     NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                     ::canUnionRight((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                                      *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                                                ),
                                     (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                                     (uint32_t)in_stack_fffffffffffffec8,
                                     (interval<unsigned_long> *)
                                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>::keyAt(this_02,i);
        }
        if (local_5d == false) break;
        newKey_00.right._0_4_ = in_stack_fffffffffffffec0;
        newKey_00.left = (unsigned_long)in_stack_fffffffffffffeb8;
        newKey_00.right._4_4_ = in_stack_fffffffffffffec4;
        unionWith::anon_class_16_2_46e3eac0::operator()
                  ((anon_class_16_2_46e3eac0 *)in_stack_fffffffffffffeb0,newKey_00);
        puVar3 = IntervalMapDetails::Path::leafOffset((Path *)0x9e5bb9);
        *puVar3 = i;
        IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::erase
                  ((iterator *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (allocator_type *)in_stack_fffffffffffffef0,
                   SUB41(in_stack_fffffffffffffeec >> 0x18,0));
        puVar3 = IntervalMapDetails::Path::leafOffset((Path *)0x9e5beb);
        *puVar3 = *puVar3 - 1;
      }
      uVar2 = IntervalMapDetails::Path::leafSize((Path *)0x9e5c0f);
      if (i != uVar2) {
        return;
      }
      bVar1 = const_iterator::isFlat(in_stack_fffffffffffffeb0);
      if (bVar1) {
        return;
      }
      IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::iterator
                ((iterator *)in_stack_fffffffffffffeb0,
                 (iterator *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      IntervalMapDetails::Path::moveRight(in_RDI,in_stack_fffffffffffffefc);
      bVar1 = const_iterator::valid((const_iterator *)0x9e5c68);
      in_stack_fffffffffffffed4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed4);
      if (bVar1) {
        in_stack_fffffffffffffec8 =
             (interval<unsigned_long> *)
             IntervalMapDetails::Path::
             leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                       ((Path *)0x9e5c85);
        in_stack_fffffffffffffec4 = IntervalMapDetails::Path::leafSize((Path *)0x9e5c99);
        bVar1 = IntervalMapDetails::
                NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                ::canUnionRight((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                                 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                                (uint32_t)in_stack_fffffffffffffec8,
                                (interval<unsigned_long> *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        in_stack_fffffffffffffec0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec0);
        if (!bVar1) goto LAB_009e5cc8;
        in_stack_fffffffffffffeb8 =
             IntervalMapDetails::Path::
             leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                       ((Path *)0x9e5d02);
        in_stack_fffffffffffffeb0 =
             (const_iterator *)
             IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>::keyAt
                       (in_stack_fffffffffffffeb8,0);
        newKey_01.right._0_4_ = in_stack_fffffffffffffec0;
        newKey_01.left = (unsigned_long)in_stack_fffffffffffffeb8;
        newKey_01.right._4_4_ = in_stack_fffffffffffffec4;
        unionWith::anon_class_16_2_46e3eac0::operator()
                  ((anon_class_16_2_46e3eac0 *)in_stack_fffffffffffffeb0,newKey_01);
        IntervalMapDetails::Path::height((Path *)in_stack_fffffffffffffeb0);
        IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::updateParentBounds
                  ((iterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (interval<unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        bVar1 = IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::erase
                          ((iterator *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                           ,(allocator_type *)in_stack_fffffffffffffef0,
                           SUB41(in_stack_fffffffffffffeec >> 0x18,0));
        in_stack_fffffffffffffeac = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
        if (bVar1) {
          IntervalMapDetails::Path::operator=
                    ((Path *)in_stack_fffffffffffffeb0,
                     (Path *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          IntervalMapDetails::Path::moveLeft(in_RDI,in_stack_fffffffffffffefc);
        }
        iVar4 = 0;
      }
      else {
LAB_009e5cc8:
        iVar4 = 1;
      }
      IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::~iterator((iterator *)0x9e5dd6);
    } while (iVar4 == 0);
  }
  else {
    IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::insert
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (monostate *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}